

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getLevelSize
          (anon_unknown_0 *this,deUint32 target,IVec3 *baseSize,int level)

{
  int i;
  long lVar1;
  int iVar2;
  IVec3 IVar3;
  
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this);
  lVar1 = 0;
  if (target == 0x8c1a) {
    for (; lVar1 != 2; lVar1 = lVar1 + 1) {
      iVar2 = baseSize->m_data[lVar1] >> ((byte)level & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      *(int *)(this + lVar1 * 4) = iVar2;
    }
    *(int *)(this + 8) = baseSize->m_data[2];
  }
  else {
    for (; lVar1 != 3; lVar1 = lVar1 + 1) {
      iVar2 = baseSize->m_data[lVar1] >> ((byte)level & 0x1f);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
      *(int *)(this + lVar1 * 4) = iVar2;
    }
  }
  IVar3.m_data[2] = 1;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 getLevelSize (deUint32 target, const IVec3& baseSize, int level)
{
	IVec3 size;

	if (target != GL_TEXTURE_2D_ARRAY)
	{
		for (int i = 0; i < 3; i++)
			size[i] = de::max(baseSize[i] >> level, 1);
	}
	else
	{
		for (int i = 0; i < 2; i++)
			size[i] = de::max(baseSize[i] >> level, 1);

		size[2] = baseSize[2];
	}

	return size;
}